

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

char ** doEnumStringList(_func_void_PHYSFS_StringCallback_void_ptr *func)

{
  PHYSFS_ErrorCode errcode;
  char **local_20;
  undefined8 local_18;
  
  local_18 = 0;
  local_20 = (char **)(*__PHYSFS_AllocatorHooks.Malloc)(8);
  if (local_20 == (char **)0x0) {
    errcode = PHYSFS_ERR_OUT_OF_MEMORY;
  }
  else {
    (*func)(enumStringListCallback,&local_20);
    errcode = local_18._4_4_;
    if (local_18._4_4_ == PHYSFS_ERR_OK) {
      local_20[local_18 & 0xffffffff] = (char *)0x0;
      return local_20;
    }
  }
  PHYSFS_setErrorCode(errcode);
  return (char **)0x0;
}

Assistant:

static char **doEnumStringList(void (*func)(PHYSFS_StringCallback, void *))
{
    EnumStringListCallbackData ecd;
    memset(&ecd, '\0', sizeof (ecd));
    ecd.list = (char **) allocator.Malloc(sizeof (char *));
    BAIL_IF(!ecd.list, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    func(enumStringListCallback, &ecd);

    if (ecd.errcode)
    {
        PHYSFS_setErrorCode(ecd.errcode);
        return NULL;
    } /* if */

    ecd.list[ecd.size] = NULL;
    return ecd.list;
}